

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O0

int fmt::v5::vfprintf<fmt::v5::basic_string_view<char>,char>
              (basic_ostream<char,_std::char_traits<char>_> *os,basic_string_view<char> *format,
              basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
              args)

{
  int iVar1;
  size_t sVar2;
  size_t extraout_RDX;
  undefined8 *in_RSI;
  basic_string_view<char> s;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this;
  basic_buffer<char> *buf;
  basic_ostream<char,_std::char_traits<char>_> *os_00;
  basic_buffer<char> *in_stack_fffffffffffffdc0;
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  in_stack_fffffffffffffdc8;
  basic_string_view<char> in_stack_fffffffffffffdd8;
  
  this = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)&stack0xfffffffffffffdc7;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (this,(allocator<char> *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdc7);
  buf = (basic_buffer<char> *)*in_RSI;
  os_00 = (basic_ostream<char,_std::char_traits<char>_> *)in_RSI[1];
  s.size_ = extraout_RDX;
  s.data_ = (char *)os_00;
  to_string_view<char>((v5 *)buf,s);
  internal::
  printf<char,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdc8);
  internal::write<char>(os_00,buf);
  sVar2 = internal::basic_buffer<char>::size((basic_buffer<char> *)&stack0xfffffffffffffdc8);
  iVar1 = (int)sVar2;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(this);
  return iVar1;
}

Assistant:

inline int vfprintf(std::basic_ostream<Char> &os,
                    const S &format,
                    basic_format_args<typename basic_printf_context_t<
                      internal::basic_buffer<Char>>::type> args) {
  basic_memory_buffer<Char> buffer;
  printf(buffer, to_string_view(format), args);
  internal::write(os, buffer);
  return static_cast<int>(buffer.size());
}